

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_loop_shape.cc
# Opt level: O0

Edge * __thiscall
S2VertexIdLaxLoopShape::chain_edge
          (Edge *__return_storage_ptr__,S2VertexIdLaxLoopShape *this,int i,int j)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  S2Point *_v0;
  S2Point *_v1;
  int local_b8;
  int k;
  S2LogMessageVoidify local_45 [20];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  int local_18;
  int local_14;
  int j_local;
  int i_local;
  S2VertexIdLaxLoopShape *this_local;
  
  local_31 = 0;
  local_18 = j;
  local_14 = i;
  _j_local = this;
  if (i != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_loop_shape.cc"
               ,0x5e,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar3 = S2LogMessage::stream(&local_30);
    poVar3 = std::operator<<(poVar3,"Check failed: (i) == (0) ");
    S2LogMessageVoidify::operator&(&local_19,poVar3);
  }
  iVar2 = local_18;
  if ((local_31 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  iVar1 = num_edges(this);
  if (iVar1 <= iVar2) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&k,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_loop_shape.cc"
               ,0x5f,kFatal,(ostream *)&std::cerr);
    poVar3 = S2LogMessage::stream((S2LogMessage *)&k);
    poVar3 = std::operator<<(poVar3,"Check failed: (j) < (num_edges()) ");
    S2LogMessageVoidify::operator&(local_45,poVar3);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&k);
  }
  iVar2 = local_18 + 1;
  iVar1 = num_vertices(this);
  if (iVar2 == iVar1) {
    local_b8 = 0;
  }
  else {
    local_b8 = local_18 + 1;
  }
  _v0 = vertex(this,local_18);
  _v1 = vertex(this,local_b8);
  S2Shape::Edge::Edge(__return_storage_ptr__,_v0,_v1);
  return __return_storage_ptr__;
}

Assistant:

S2Shape::Edge S2VertexIdLaxLoopShape::chain_edge(int i, int j) const {
  S2_DCHECK_EQ(i, 0);
  S2_DCHECK_LT(j, num_edges());
  int k = (j + 1 == num_vertices()) ? 0 : j + 1;
  return Edge(vertex(j), vertex(k));
}